

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

void helper_stmw_ppc64(CPUPPCState_conflict2 *env,target_ulong addr,uint32_t reg)

{
  int mmu_idx;
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  uintptr_t unaff_retaddr;
  
  mmu_idx = env->dmmu_idx;
  puVar2 = (uint *)probe_contiguous(env,addr,reg * -4 + 0x80,MMU_DATA_STORE,mmu_idx,unaff_retaddr);
  uVar3 = (ulong)reg;
  if (puVar2 == (uint *)0x0) {
    for (; uVar3 < 0x20; uVar3 = uVar3 + 1) {
      cpu_stl_mmuidx_ra_ppc64(env,addr,(uint32_t)env->gpr[uVar3],mmu_idx,unaff_retaddr);
      addr = addr_add(env,addr,4);
    }
  }
  else {
    for (; uVar3 < 0x20; uVar3 = uVar3 + 1) {
      uVar1 = (uint)env->gpr[uVar3];
      *puVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      puVar2 = puVar2 + 1;
    }
  }
  return;
}

Assistant:

void helper_stmw(CPUPPCState *env, target_ulong addr, uint32_t reg)
{
    uintptr_t raddr = GETPC();
    int mmu_idx = cpu_mmu_index(env, false);
    char *host = probe_contiguous(env, addr, (32 - reg) * 4,
                                  MMU_DATA_STORE, mmu_idx, raddr);

    if (likely(host)) {
        /* Fast path -- the entire operation is in RAM at host.  */
        for (; reg < 32; reg++) {
            stl_be_p(host, env->gpr[reg]);
            host += 4;
        }
    } else {
        /* Slow path -- at least some of the operation requires i/o.  */
        for (; reg < 32; reg++) {
            cpu_stl_mmuidx_ra(env, addr, env->gpr[reg], mmu_idx, raddr);
            addr = addr_add(env, addr, 4);
        }
    }
}